

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall
pugi::xml_node::insert_attribute_before(xml_node *this,char_t *name_,xml_attribute *attr)

{
  bool bVar1;
  xml_node_type parent;
  xml_attribute_struct *attr_00;
  xml_attribute local_38;
  xml_attribute a;
  xml_allocator *alloc;
  xml_attribute *attr_local;
  char_t *name__local;
  xml_node *this_local;
  
  parent = type(this);
  bVar1 = impl::anon_unknown_0::allow_insert_attribute(parent);
  if (bVar1) {
    bVar1 = xml_attribute::operator!(attr);
    if ((!bVar1) && (bVar1 = impl::anon_unknown_0::is_attribute_of(attr->_attr,this->_root), bVar1))
    {
      a._attr = (xml_attribute_struct *)
                impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve((xml_allocator *)a._attr);
      if (!bVar1) {
        xml_attribute::xml_attribute((xml_attribute *)&this_local);
        return (xml_attribute)(xml_attribute_struct *)this_local;
      }
      attr_00 = impl::anon_unknown_0::allocate_attribute(a._attr);
      xml_attribute::xml_attribute(&local_38,attr_00);
      bVar1 = xml_attribute::operator!(&local_38);
      if (!bVar1) {
        impl::anon_unknown_0::insert_attribute_before(local_38._attr,attr->_attr,this->_root);
        xml_attribute::set_name(&local_38,name_);
        return (xml_attribute)local_38._attr;
      }
      xml_attribute::xml_attribute((xml_attribute *)&this_local);
      return (xml_attribute)(xml_attribute_struct *)this_local;
    }
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
  }
  else {
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
  }
  return (xml_attribute)(xml_attribute_struct *)this_local;
}

Assistant:

PUGI__FN xml_attribute xml_node::insert_attribute_before(const char_t* name_, const xml_attribute& attr)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();
		if (!attr || !impl::is_attribute_of(attr._attr, _root)) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::insert_attribute_before(a._attr, attr._attr, _root);

		a.set_name(name_);

		return a;
	}